

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O3

Module * __thiscall soul::Program::addGraph(Program *this,int index)

{
  ProgramImpl *this_00;
  PoolItem *pPVar1;
  Module *pMVar2;
  
  this_00 = this->pimpl;
  pPVar1 = PoolAllocator::allocateSpaceForObject(&(this_00->allocator).pool,0x488);
  Module::Module((Module *)&pPVar1->item,this,graphModule);
  pPVar1->destructor =
       PoolAllocator::allocate<soul::Module,_soul::Program_&,_soul::Module::ModuleType>::
       anon_class_1_0_00000001::__invoke;
  pMVar2 = ProgramImpl::insert(this_00,index,(Module *)&pPVar1->item);
  return pMVar2;
}

Assistant:

Module& Program::addGraph (int index)                                                   { return pimpl->insert (index, Module::createGraph     (*this)); }